

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int rfft2b_(int *ldim,int *l,int *m,double *r__,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *l_00;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  int i__1;
  int ier1;
  int local_94;
  int *local_90;
  int mmsav;
  double *local_80;
  int mwsav;
  int ldw;
  int ldh;
  int *local_68;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  ulong local_40;
  int i__3;
  
  local_60 = (ulong)*ldim;
  *ier = 0;
  iVar16 = *l;
  local_90 = ldim;
  local_80 = r__;
  local_58 = wsave;
  dVar17 = log((double)iVar16);
  iVar16 = (int)(dVar17 / 0.6931471805599453) + iVar16;
  iVar5 = *m;
  dVar17 = log((double)iVar5);
  iVar15 = (int)(dVar17 / 0.6931471805599453) + iVar5 * 2 + 4;
  iVar5 = *m;
  mwsav = iVar15;
  dVar17 = log((double)iVar5);
  pdVar12 = local_80;
  piVar3 = local_90;
  mmsav = iVar5 + (int)(dVar17 / 0.6931471805599453) + 4;
  iVar5 = iVar16 + iVar15 + 4;
  iVar15 = 2;
  if (mmsav + iVar5 <= *lensav) {
    uVar7 = *l;
    uVar1 = *m;
    iVar15 = 3;
    if ((int)((uVar7 + 1) * uVar1) <= *lenwrk) {
      iVar2 = *local_90;
      iVar15 = 5;
      if ((int)uVar7 <= iVar2) {
        local_40 = ~local_60;
        uVar11 = (uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1 & 0xfffffffe;
        if (2 < (int)uVar1) {
          uVar9 = 3;
          if (3 < (int)uVar11) {
            uVar9 = (ulong)uVar11;
          }
          pdVar8 = local_80 + local_40 + local_60 * 2 + 1;
          lVar10 = uVar9 - 2;
          do {
            *pdVar8 = *pdVar8 + *pdVar8;
            pdVar8 = pdVar8 + local_60;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        local_48 = local_58 + -1;
        if (2 < (int)uVar1) {
          pdVar8 = local_80 + local_60 * 3 + local_40 + 1;
          uVar9 = 3;
          do {
            *pdVar8 = -*pdVar8;
            uVar9 = uVar9 + 2;
            pdVar8 = pdVar8 + local_60 * 2;
          } while (uVar9 <= uVar1);
        }
        i__1 = iVar2 * uVar1;
        local_50 = local_48 + (long)iVar5 + 1;
        local_68 = l;
        rfftmb_(&c__1,&c__1,m,local_90,local_80,&i__1,local_50,&mmsav,work,lenwrk,&ier1);
        l_00 = local_68;
        iVar5 = *local_68;
        iVar15 = (iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1;
        ldh = iVar15;
        if (2 < iVar5) {
          ldw = iVar15 * 2;
          r2w_(piVar3,&ldw,local_68,m,pdVar12,work);
          i__1 = iVar15 + -1;
          local_94 = iVar15 * *m;
          i__3 = *m * *l_00;
          cfftmb_(&i__1,&c__1,m,&ldh,(fft_complex_t *)(work + 1),&local_94,
                  local_48 + (long)iVar16 + 5,&mwsav,local_80,&i__3,&ier1);
          pdVar12 = local_80;
          iVar15 = 0x14;
          if (ier1 != 0) goto LAB_00137199;
          w2r_(local_90,&ldw,l_00,m,local_80,work);
        }
        uVar4 = local_40;
        uVar9 = local_60;
        if ((uVar7 & 1) == 0) {
          iVar16 = *m;
          uVar7 = (iVar16 - (iVar16 + 1 >> 0x1f)) + 1U & 0xfffffffe;
          if (2 < (long)iVar16) {
            uVar6 = 3;
            if (3 < (int)uVar7) {
              uVar6 = (ulong)uVar7;
            }
            pdVar8 = pdVar12 + local_40 + (long)*l_00 + local_60 * 2;
            lVar10 = uVar6 - 2;
            do {
              *pdVar8 = *pdVar8 + *pdVar8;
              pdVar8 = pdVar8 + local_60;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
          if (2 < iVar16) {
            pdVar8 = pdVar12 + local_40 + local_60 * 3 + (long)*l_00;
            uVar6 = 3;
            do {
              *pdVar8 = -*pdVar8;
              uVar6 = uVar6 + 2;
              pdVar8 = pdVar8 + local_60 * 2;
            } while (uVar6 <= (ulong)(long)iVar16);
          }
          i__1 = *local_90 * iVar16;
          rfftmb_(&c__1,&c__1,m,local_90,pdVar12 + local_40 + (long)*l_00 + local_60,&i__1,local_50,
                  &mmsav,work,lenwrk,&ier1);
        }
        piVar3 = local_90;
        iVar16 = *l_00;
        uVar7 = (iVar16 - (iVar16 + 1 >> 0x1f)) + 1U & 0xfffffffe;
        if (2 < iVar16) {
          local_94 = *m;
          uVar6 = 3;
          if (3 < (int)uVar7) {
            uVar6 = (ulong)uVar7;
          }
          pdVar8 = pdVar12 + uVar9 + uVar4 + 2;
          uVar14 = 2;
          do {
            lVar10 = (ulong)(local_94 + 1) - 1;
            pdVar12 = pdVar8;
            if (0 < local_94) {
              do {
                *pdVar12 = *pdVar12 + *pdVar12;
                lVar10 = lVar10 + -1;
                pdVar12 = pdVar12 + uVar9;
              } while (lVar10 != 0);
            }
            uVar14 = uVar14 + 1;
            pdVar8 = pdVar8 + 1;
            pdVar12 = local_80;
          } while (uVar14 != uVar6);
        }
        uVar1 = *m;
        if (0 < (int)uVar1) {
          pdVar8 = pdVar12 + uVar9 + uVar4;
          lVar10 = 1;
          do {
            if (2 < iVar16) {
              lVar13 = 3;
              do {
                pdVar8[lVar13] = -pdVar8[lVar13];
                lVar13 = lVar13 + 2;
              } while (lVar13 < (int)uVar7);
            }
            lVar10 = lVar10 + 1;
            pdVar8 = pdVar8 + uVar9;
            local_94 = uVar7 - 1;
          } while (lVar10 != (ulong)uVar1 + 1);
        }
        i__1 = uVar1 * *local_90;
        dVar17 = log((double)iVar16);
        local_94 = (int)(dVar17 / 0.6931471805599453) + iVar16 + 4;
        rfftmb_(m,piVar3,local_68,&c__1,pdVar12,&i__1,local_58,&local_94,work,lenwrk,&ier1);
        iVar15 = 0x14;
        if (ier1 == 0) {
          return 0;
        }
      }
    }
  }
LAB_00137199:
  *ier = iVar15;
  return 0;
}

Assistant:

int rfft2b_(int *ldim, int *l, int *m, fft_real_t *r__,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int r_dim1, r_offset, i__1, i__2, i__3;

    /* Builtin functions */


    /* Local variables */
     int i__, j;
    extern /* Subroutine */ int r2w_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *), w2r_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *);
     int ldh, ldw, ldx, ier1, modl, modm, mmsav, lwsav, mwsav;
    extern /* Subroutine */ int cfftmb_(), rfftmb_(int *, int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, int *), xerfft_(char *, int *, ftnlen);



/* INITIALIZE IER */

    /* Parameter adjustments */
    r_dim1 = *ldim;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

/* VERIFY LENSAV */

    lwsav = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    mwsav = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    mmsav = *m + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    modl = *l % 2;
    modm = *m % 2;

    if (*lensav < lwsav + mwsav + mmsav) {
	*ier = 2;
	//xerfft_("RFFT2F", &c__6, (ftnlen)6);
	goto L100;
    }

/* VERIFY LENWRK */

    if (*lenwrk < (*l + 1) * *m) {
	*ier = 3;
	//xerfft_("RFFT2F", &c__8, (ftnlen)6);
	goto L100;
    }

/* VERIFY LDIM IS AS BIG AS L */

    if (*ldim < *l) {
	*ier = 5;
	//xerfft_("RFFT2F", &c_n6, (ftnlen)6);
	goto L100;
    }

/* TRANSFORM SECOND DIMENSION OF ARRAY */

    i__1 = ((*m + 1) / 2 << 1) - 1;
    for (j = 2; j <= i__1; ++j) {
	r__[j * r_dim1 + 1] += r__[j * r_dim1 + 1];
    }
    i__1 = *m;
    for (j = 3; j <= i__1; j += 2) {
	r__[j * r_dim1 + 1] = -r__[j * r_dim1 + 1];
    }
    i__1 = *m * *ldim;
    rfftmb_(&c__1, &c__1, m, ldim, &r__[r_offset], &i__1, &wsave[lwsav +
	    mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    ldh = (*l + 1) / 2;
    if (ldh > 1) {
	ldw = ldh + ldh;

/*     R AND WORK ARE SWITCHED BECAUSE THE THE FIRST DIMENSION */
/*     OF THE INPUT TO COMPLEX CFFTMF MUST BE EVEN. */

	r2w_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
	i__1 = ldh - 1;
	i__2 = ldh * *m;
	i__3 = *l * *m;
	cfftmb_(&i__1, &c__1, m, &ldh, (complex*)&work[2], &i__2, &wsave[lwsav + 1], &
		mwsav, &r__[r_offset], &i__3, &ier1);
	if (ier1 != 0) {
	    *ier = 20;
	    //xerfft_("RFFT2B", &c_n5, (ftnlen)6);
	    goto L100;
	}
	w2r_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
    }

    if (modl == 0) {
	i__1 = ((*m + 1) / 2 << 1) - 1;
	for (j = 2; j <= i__1; ++j) {
	    r__[*l + j * r_dim1] += r__[*l + j * r_dim1];
	}
	i__1 = *m;
	for (j = 3; j <= i__1; j += 2) {
	    r__[*l + j * r_dim1] = -r__[*l + j * r_dim1];
	}
	i__1 = *m * *ldim;
	rfftmb_(&c__1, &c__1, m, ldim, &r__[*l + r_dim1], &i__1, &wsave[lwsav
		+ mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    }

/*     PRINT*, 'BACKWARD TRANSFORM IN THE J DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

/* TRANSFORM FIRST DIMENSION OF ARRAY */

    ldx = ((*l + 1) / 2 << 1) - 1;
    i__1 = ldx;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *m;
	for (j = 1; j <= i__2; ++j) {
	    r__[i__ + j * r_dim1] += r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ldx;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    r__[i__ + j * r_dim1] = -r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m * *ldim;
    i__2 = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    rfftmb_(m, ldim, l, &c__1, &r__[r_offset], &i__1, &wsave[1], &i__2, &work[
	    1], lenwrk, &ier1);


/*     PRINT*, 'BACKWARD TRANSFORM IN THE I DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

L100:

    return 0;
}